

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcat.c
# Opt level: O1

char * strcat(char *__dest,char *__src)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  char *rc;
  
  cVar1 = *__dest;
  pcVar2 = __dest;
  while (cVar1 != '\0') {
    cVar1 = pcVar2[1];
    pcVar2 = pcVar2 + 1;
  }
  lVar3 = 0;
  do {
    cVar1 = __src[lVar3];
    pcVar2[lVar3] = cVar1;
    lVar3 = lVar3 + 1;
  } while (cVar1 != '\0');
  return __dest;
}

Assistant:

char * strcat( char * _PDCLIB_restrict s1, const char * _PDCLIB_restrict s2 )
{
    char * rc = s1;

    if ( *s1 )
    {
        while ( *++s1 )
        {
            /* EMPTY */
        }
    }

    while ( ( *s1++ = *s2++ ) )
    {
        /* EMPTY */
    }

    return rc;
}